

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1533.c
# Opt level: O0

size_t read_callback(void *ptr,size_t size,size_t nitems,void *userdata)

{
  undefined8 local_48;
  size_t bytes_to_send;
  size_t totalsize;
  cb_data *data;
  void *userdata_local;
  size_t nitems_local;
  size_t size_local;
  void *ptr_local;
  
  if (*(int *)((long)userdata + 8) == 0) {
    *(undefined4 *)((long)userdata + 0xc) = 1;
    ptr_local = (void *)0x10000001;
  }
  else {
    local_48 = *(void **)((long)userdata + 0x10);
    if ((void *)(nitems * size) < *(void **)((long)userdata + 0x10)) {
      local_48 = (void *)(nitems * size);
    }
    memset(ptr,0x61,(size_t)local_48);
    *(long *)((long)userdata + 0x10) = *(long *)((long)userdata + 0x10) - (long)local_48;
    ptr_local = local_48;
  }
  return (size_t)ptr_local;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nitems,
                            void *userdata)
{
  struct cb_data *data = (struct cb_data *)userdata;

  /* wait until the server has sent all response headers */
  if(data->response_received) {
    size_t totalsize = nitems * size;

    size_t bytes_to_send = data->remaining_bytes;
    if(bytes_to_send > totalsize) {
      bytes_to_send = totalsize;
    }

    memset(ptr, 'a', bytes_to_send);
    data->remaining_bytes -= bytes_to_send;

    return bytes_to_send;
  }
  else {
    data->paused = 1;
    return CURL_READFUNC_PAUSE;
  }
}